

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

bool __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
::searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
          (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,3,unsigned_long>
           *this,KNNResultSet<double,_unsigned_long,_unsigned_long> *result_set,ElementType *vec,
          NodePtr node,DistanceType mindistsq,distance_vector_t *dists,float epsError)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  const_reference pvVar4;
  reference pvVar5;
  DistanceType DVar6;
  DistanceType dist_00;
  double mindistsq_00;
  DistanceType dst;
  DistanceType cut_dist;
  NodePtr otherChild;
  NodePtr bestChild;
  DistanceType diff2;
  DistanceType diff1;
  ElementType val;
  int idx;
  DistanceType dist;
  unsigned_long index;
  unsigned_long i;
  DistanceType worst_dist;
  float epsError_local;
  distance_vector_t *dists_local;
  DistanceType mindistsq_local;
  NodePtr node_local;
  ElementType *vec_local;
  KNNResultSet<double,_unsigned_long,_unsigned_long> *result_set_local;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  *this_local;
  
  if ((node->child1 == (Node *)0x0) && (node->child2 == (Node *)0x0)) {
    DVar6 = KNNResultSet<double,_unsigned_long,_unsigned_long>::worstDist(result_set);
    for (index = (node->node_type).lr.left; index < (node->node_type).lr.right; index = index + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,index);
      dist_00 = L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>
                ::evalMetric((L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>
                              *)(this + 0xa8),vec,*pvVar4,3);
      if (dist_00 < DVar6) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,index);
        bVar3 = KNNResultSet<double,_unsigned_long,_unsigned_long>::addPoint
                          (result_set,dist_00,*pvVar4);
        if (!bVar3) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    iVar2 = (node->node_type).sub.divfeat;
    dVar1 = vec[iVar2];
    if (0.0 <= (dVar1 - (node->node_type).sub.divlow) + (dVar1 - (node->node_type).sub.divhigh)) {
      otherChild = node->child2;
      cut_dist = (DistanceType)node->child1;
      dst = L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
            ::accum_dist<double,double>
                      ((L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
                        *)(this + 0xa8),dVar1,(node->node_type).sub.divlow,(long)iVar2);
    }
    else {
      otherChild = node->child1;
      cut_dist = (DistanceType)node->child2;
      dst = L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
            ::accum_dist<double,double>
                      ((L2_Simple_Adaptor<double,anurbs::PointOnSurfaceProjection<3l>::PointCloudAdaptor,double>
                        *)(this + 0xa8),dVar1,(node->node_type).sub.divhigh,(long)iVar2);
    }
    bVar3 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                      (this,result_set,vec,otherChild,mindistsq,dists,epsError);
    if (bVar3) {
      pvVar5 = std::array<double,_3UL>::operator[](dists,(long)iVar2);
      dVar1 = *pvVar5;
      mindistsq_00 = (mindistsq + dst) - dVar1;
      pvVar5 = std::array<double,_3UL>::operator[](dists,(long)iVar2);
      *pvVar5 = dst;
      DVar6 = KNNResultSet<double,_unsigned_long,_unsigned_long>::worstDist(result_set);
      if ((DVar6 < mindistsq_00 * (double)epsError) ||
         (bVar3 = searchLevel<nanoflann::KNNResultSet<double,unsigned_long,unsigned_long>>
                            (this,result_set,vec,(NodePtr)cut_dist,mindistsq_00,dists,epsError),
         bVar3)) {
        pvVar5 = std::array<double,_3UL>::operator[](dists,(long)iVar2);
        *pvVar5 = dVar1;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool searchLevel(RESULTSET &result_set, const ElementType *vec,
                   const NodePtr node, DistanceType mindistsq,
                   distance_vector_t &dists, const float epsError) const {
    /* If this is a leaf node, then do check and return. */
    if ((node->child1 == NULL) && (node->child2 == NULL)) {
      // count_leaf += (node->lr.right-node->lr.left);  // Removed since was
      // neither used nor returned to the user.
      DistanceType worst_dist = result_set.worstDist();
      for (IndexType i = node->node_type.lr.left; i < node->node_type.lr.right;
           ++i) {
        const IndexType index = BaseClassRef::vind[i]; // reorder... : i;
        DistanceType dist = distance.evalMetric(
            vec, index, (DIM > 0 ? DIM : BaseClassRef::dim));
        if (dist < worst_dist) {
          if (!result_set.addPoint(dist, BaseClassRef::vind[i])) {
            // the resultset doesn't want to receive any more points, we're done
            // searching!
            return false;
          }
        }
      }
      return true;
    }

    /* Which child branch should be taken first? */
    int idx = node->node_type.sub.divfeat;
    ElementType val = vec[idx];
    DistanceType diff1 = val - node->node_type.sub.divlow;
    DistanceType diff2 = val - node->node_type.sub.divhigh;

    NodePtr bestChild;
    NodePtr otherChild;
    DistanceType cut_dist;
    if ((diff1 + diff2) < 0) {
      bestChild = node->child1;
      otherChild = node->child2;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divhigh, idx);
    } else {
      bestChild = node->child2;
      otherChild = node->child1;
      cut_dist = distance.accum_dist(val, node->node_type.sub.divlow, idx);
    }

    /* Call recursively to search next level down. */
    if (!searchLevel(result_set, vec, bestChild, mindistsq, dists, epsError)) {
      // the resultset doesn't want to receive any more points, we're done
      // searching!
      return false;
    }

    DistanceType dst = dists[idx];
    mindistsq = mindistsq + cut_dist - dst;
    dists[idx] = cut_dist;
    if (mindistsq * epsError <= result_set.worstDist()) {
      if (!searchLevel(result_set, vec, otherChild, mindistsq, dists,
                       epsError)) {
        // the resultset doesn't want to receive any more points, we're done
        // searching!
        return false;
      }
    }
    dists[idx] = dst;
    return true;
  }